

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_parser_hlsl.h
# Opt level: O0

void yy_shift(yyParser *yypParser,int yyNewState,int yyMajor,YYMINORTYPE *yypMinor)

{
  yyStackEntry *pyVar1;
  yyStackEntry *yytos;
  YYMINORTYPE *yypMinor_local;
  int yyMajor_local;
  int yyNewState_local;
  yyParser *yypParser_local;
  
  yypParser->yyidx = yypParser->yyidx + 1;
  if (yypParser->yyidx < 100) {
    pyVar1 = yypParser->yystack + yypParser->yyidx;
    pyVar1->stateno = (unsigned_short)yyNewState;
    pyVar1->major = (uchar)yyMajor;
    pyVar1->minor = *yypMinor;
  }
  else {
    yyStackOverflow(yypParser,yypMinor);
  }
  return;
}

Assistant:

static void yy_shift(
  yyParser *yypParser,          /* The parser to be shifted */
  int yyNewState,               /* The new state to shift in */
  int yyMajor,                  /* The major token to shift in */
  YYMINORTYPE *yypMinor         /* Pointer to the minor token to shift in */
){
  yyStackEntry *yytos;
  yypParser->yyidx++;
#ifdef YYTRACKMAXSTACKDEPTH
  if( yypParser->yyidx>yypParser->yyidxMax ){
    yypParser->yyidxMax = yypParser->yyidx;
  }
#endif
#if YYSTACKDEPTH>0 
  if( yypParser->yyidx>=YYSTACKDEPTH ){
    yyStackOverflow(yypParser, yypMinor);
    return;
  }
#else
  if( yypParser->yyidx>=yypParser->yystksz ){
    yyGrowStack(yypParser);
    if( yypParser->yyidx>=yypParser->yystksz ){
      yyStackOverflow(yypParser, yypMinor);
      return;
    }
  }
#endif
  yytos = &yypParser->yystack[yypParser->yyidx];
  yytos->stateno = (YYACTIONTYPE)yyNewState;
  yytos->major = (YYCODETYPE)yyMajor;
  yytos->minor = *yypMinor;
#if LEMON_SUPPORT_TRACING   /* __MOJOSHADER__ */
  if( yyTraceFILE && yypParser->yyidx>0 ){
    int i;
    fprintf(yyTraceFILE,"%sShift %d\n",yyTracePrompt,yyNewState);
    fprintf(yyTraceFILE,"%sStack:",yyTracePrompt);
    for(i=1; i<=yypParser->yyidx; i++)
      fprintf(yyTraceFILE," %s",yyTokenName[yypParser->yystack[i].major]);
    fprintf(yyTraceFILE,"\n");
  }
#endif
}